

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm_init.c
# Opt level: O0

void comm_test(MPI_Comm comm)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  int *in_RDI;
  double dVar8;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int rank;
  int ok;
  int nelems;
  int prem;
  int nprocs;
  int me;
  int g_a;
  int two;
  int dims [2];
  int hi [2];
  int lo [2];
  int ld;
  int jj;
  int ii;
  int j;
  int i;
  double *buf;
  int *in_stack_00000070;
  void *in_stack_00000078;
  int *in_stack_00000080;
  int *in_stack_00000088;
  int in_stack_00000094;
  int in_stack_ffffffffffffffa4;
  int local_34;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_18;
  uint local_14;
  undefined8 in_stack_fffffffffffffff0;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffff0 >> 0x20);
  MPI_Comm_rank(in_RDI,&stack0xffffffffffffffa4);
  iVar3 = GA_Initialize_comm((MPI_Comm)0x10361a);
  if (iVar3 != 0) {
    uVar4 = GA_Nodeid();
    uVar5 = GA_Nnodes();
    if (uVar4 == 0) {
      printf("\nRunning comm_test on %d processors\n\n",(ulong)uVar5);
    }
    NGA_Create_handle();
    NGA_Set_data(unaff_retaddr_00,unaff_retaddr,in_RDI,iVar6);
    NGA_Allocate(in_stack_ffffffffffffffa4);
    GA_Zero(in_stack_ffffffffffffffa4);
    NGA_Distribution(ld,lo[1],stack0x00000038,stack0x00000030);
    pvVar7 = malloc((long)(int)(((local_34 - local_2c) + 1) * ((local_30 - local_28) + 1)) << 3);
    for (local_14 = local_2c; (int)local_14 <= local_34; local_14 = local_14 + 1) {
      for (local_18 = local_28; (int)local_18 <= local_30; local_18 = local_18 + 1) {
        *(double *)
         ((long)pvVar7 +
         (long)(int)((local_14 - local_2c) * ((local_30 - local_28) + 1) + (local_18 - local_28)) *
         8) = (double)(int)(local_14 * 0x100 + local_18);
      }
    }
    NGA_Put(in_stack_00000094,in_stack_00000088,in_stack_00000080,in_stack_00000078,
            in_stack_00000070);
    GA_Sync();
    free(pvVar7);
    NGA_Distribution(ld,lo[1],stack0x00000038,stack0x00000030);
    iVar3 = ((local_34 - local_2c) + 1) * ((local_30 - local_28) + 1);
    iVar6 = (local_30 - local_28) + 1;
    pvVar7 = malloc((long)iVar3 << 3);
    for (local_14 = 0; (int)local_14 < iVar3; local_14 = local_14 + 1) {
      *(undefined8 *)((long)pvVar7 + (long)(int)local_14 * 8) = 0;
    }
    NGA_Get(in_stack_00000094,in_stack_00000088,in_stack_00000080,in_stack_00000078,
            in_stack_00000070);
    bVar2 = true;
    for (local_14 = local_2c; (int)local_14 <= local_34; local_14 = local_14 + 1) {
      for (local_18 = local_28; (int)local_18 <= local_30; local_18 = local_18 + 1) {
        dVar1 = *(double *)
                 ((long)pvVar7 +
                 (long)(int)((local_14 - local_2c) * iVar6 + (local_18 - local_28)) * 8);
        dVar8 = (double)(int)(local_14 * 0x100 + local_18);
        if (((dVar1 != dVar8) || (NAN(dVar1) || NAN(dVar8))) && (bVar2)) {
          printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",
                 *(undefined8 *)
                  ((long)pvVar7 +
                  (long)(int)((local_14 - local_2c) * iVar6 + (local_18 - local_28)) * 8),
                 (double)(int)(local_14 * 0x100 + local_18),(ulong)uVar4,(ulong)local_14,
                 (ulong)local_18);
          bVar2 = false;
        }
      }
    }
    free(pvVar7);
    if ((uVar4 == 0) && (bVar2)) {
      printf("Test passed\n");
    }
    else if (!bVar2) {
      printf("Test failed\n");
    }
    GA_Terminate();
  }
  return;
}

Assistant:

void comm_test(MPI_Comm comm)
{
  double *buf;
  int i, j, ii, jj, ld;
  int lo[2], hi[2];
  int dims[2];
  int two = 2;
  int g_a;
  int me, nprocs, prem;
  int nelems, ok;
  int rank;
  MPI_Comm_rank(comm,&rank);
  if (GA_Initialize_comm(comm)) {
    me = GA_Nodeid();
    nprocs = GA_Nnodes();
    prem = (me+1)%nprocs;
    if (me == 0) {
      printf("\nRunning comm_test on %d processors\n\n",nprocs);
    }

    g_a = NGA_Create_handle();
    dims[0] = DIM;
    dims[1] = DIM;
    NGA_Set_data(g_a,two,dims,C_DBL);
    NGA_Allocate(g_a);
    GA_Zero(g_a);

    /* Find out what section of global array I'm writing to */
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        buf[ii*ld+jj] = (double)(i*DIM+j);
      }
    }
    NGA_Put(g_a,lo,hi,buf,&ld);
    GA_Sync();
    free(buf);
    /* Copy data from a different section of global array and check values */
    prem = me-1;
    if (prem < 0) prem = nprocs-1;
    NGA_Distribution(g_a,prem,lo,hi);
    nelems = (hi[0]-lo[0]+1)*(hi[1]-lo[1]+1);
    ld = hi[1]-lo[1]+1;
    buf = (double*)malloc(nelems*sizeof(double));
    for (i=0; i<nelems; i++) buf[i] = 0.0;
    NGA_Get(g_a,lo,hi,buf,&ld);

    ok = 1;
    for (i=lo[0]; i<=hi[0]; i++) {
      ii = i-lo[0];
      for (j=lo[1]; j<=hi[1]; j++) {
        jj = j-lo[1];
        if (buf[ii*ld+jj] != (double)(i*DIM+j)) {
          if (ok == 1) {
            printf("p[%d] Mismatch for (%d,%d) expected: %f actual: %f\n",
                me,i,j,buf[ii*ld+jj],(double)(i*DIM+j));
            ok = 0;
          }
        }
      }
    }
    free(buf);
    if (me == 0 && ok) {
      printf("Test passed\n");
    } else if (!ok) {
      printf("Test failed\n");
    }
    GA_Terminate();
  }
}